

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O1

int get_window_wiener_var(AV1_COMP *cpi,BLOCK_SIZE bsize,int mi_row,int mi_col)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  short sVar4;
  WeberStats *pWVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int row;
  undefined7 in_register_00000031;
  int iVar17;
  int col;
  int iVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  double dVar22;
  double dStack_40;
  
  uVar16 = CONCAT71(in_register_00000031,bsize) & 0xffffffff;
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [cpi->weber_bsize];
  iVar15 = (cpi->frame_info).mi_cols;
  iVar17 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [uVar16] + mi_row;
  bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar16];
  dVar11 = (double)DAT_004d32d0;
  uVar19 = DAT_004d32d0._8_4_;
  uVar20 = DAT_004d32d0._12_4_;
  iVar14 = 0;
  dVar21 = 1.0;
  iVar18 = mi_col;
  do {
    if ((mi_row < (cpi->common).mi_params.mi_rows) && (iVar18 < (cpi->common).mi_params.mi_cols)) {
      pWVar5 = cpi->mb_weber_stats;
      iVar13 = iVar18 / (int)(uint)bVar1 + (mi_row / (int)(uint)bVar1) * iVar15;
      lVar6 = pWVar5[iVar13].distortion;
      dVar7 = (double)pWVar5[iVar13].src_variance;
      auVar12._8_4_ = uVar19;
      auVar12._0_8_ = dVar11;
      auVar12._12_4_ = uVar20;
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      sVar3 = pWVar5[iVar13].rec_pix_max;
      dVar8 = (double)pWVar5[iVar13].src_variance;
      if (dVar8 < 0.0) {
        dVar8 = sqrt(dVar8);
      }
      else {
        dVar8 = SQRT(dVar8);
      }
      sVar4 = pWVar5[iVar13].src_pix_max;
      dVar9 = (double)pWVar5[iVar13].rec_variance;
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      dVar22 = (double)pWVar5[iVar13].distortion;
      if (dVar22 < 0.0) {
        dVar22 = sqrt(dVar22);
      }
      else {
        dVar22 = SQRT(dVar22);
      }
      dVar10 = (double)(int)pWVar5[iVar13].src_pix_max;
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      dVar21 = dVar21 + ABS(dVar8 * (double)(int)sVar3 - (double)(int)sVar4 * dVar9);
      dStack_40 = auVar12._8_8_;
      dVar11 = dVar11 + (double)(int)sVar3 * dVar7 * (double)lVar6;
      dStack_40 = dStack_40 + dVar22 * dVar10 * 0.1;
      uVar19 = SUB84(dStack_40,0);
      uVar20 = (undefined4)((ulong)dStack_40 >> 0x20);
      iVar14 = iVar14 + 1;
    }
    iVar18 = iVar18 + (uint)bVar1;
  } while ((iVar18 < (int)((uint)bVar2 + mi_col)) ||
          (mi_row = mi_row + (uint)bVar1, iVar18 = mi_col, mi_row < iVar17));
  iVar18 = (int)(((dVar11 + (double)CONCAT44(uVar20,uVar19)) /
                 (dVar21 + (double)CONCAT44(uVar20,uVar19))) / (double)iVar14);
  iVar15 = 1;
  if (1 < iVar18) {
    iVar15 = iVar18;
  }
  return iVar15;
}

Assistant:

static int get_window_wiener_var(const AV1_COMP *const cpi, BLOCK_SIZE bsize,
                                 int mi_row, int mi_col) {
  const AV1_COMMON *const cm = &cpi->common;
  const int mi_wide = mi_size_wide[bsize];
  const int mi_high = mi_size_high[bsize];

  const int mi_step = mi_size_wide[cpi->weber_bsize];
  int sb_wiener_var = 0;
  int mb_stride = cpi->frame_info.mi_cols;
  int mb_count = 0;
  double base_num = 1;
  double base_den = 1;
  double base_reg = 1;

  for (int row = mi_row; row < mi_row + mi_high; row += mi_step) {
    for (int col = mi_col; col < mi_col + mi_wide; col += mi_step) {
      if (row >= cm->mi_params.mi_rows || col >= cm->mi_params.mi_cols)
        continue;

      const WeberStats *weber_stats =
          &cpi->mb_weber_stats[(row / mi_step) * mb_stride + (col / mi_step)];

      base_num += ((double)weber_stats->distortion) *
                  sqrt((double)weber_stats->src_variance) *
                  weber_stats->rec_pix_max;

      base_den += fabs(
          weber_stats->rec_pix_max * sqrt((double)weber_stats->src_variance) -
          weber_stats->src_pix_max * sqrt((double)weber_stats->rec_variance));

      base_reg += sqrt((double)weber_stats->distortion) *
                  sqrt((double)weber_stats->src_pix_max) * 0.1;
      ++mb_count;
    }
  }

  sb_wiener_var =
      (int)(((base_num + base_reg) / (base_den + base_reg)) / mb_count);
  sb_wiener_var = AOMMAX(1, sb_wiener_var);

  return (int)sb_wiener_var;
}